

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_binder.cpp
# Opt level: O1

void duckdb::IndexBinder::InitCreateIndexInfo(LogicalGet *get,CreateIndexInfo *info,string *schema)

{
  pointer pCVar1;
  iterator __position;
  vector<duckdb::ColumnIndex,_true> *pvVar2;
  reference __x;
  BinderException *this;
  pointer pCVar3;
  idx_t col_id;
  undefined1 local_50 [32];
  
  pvVar2 = LogicalGet::GetColumnIds(get);
  pCVar3 = (pvVar2->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
           super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (pvVar2->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
           super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar3 != pCVar1) {
    do {
      if (pCVar3->index == 0xffffffffffffffff) {
        this = (BinderException *)__cxa_allocate_exception(0x10);
        local_50._0_8_ = local_50 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"cannot create an index on the rowid","");
        BinderException::BinderException(this,(string *)local_50);
        __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_50._0_8_ = pCVar3->index;
      __position._M_current =
           (info->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (info->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&info->column_ids,
                   __position,(unsigned_long *)local_50);
      }
      else {
        *__position._M_current = local_50._0_8_;
        (info->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      __x = vector<duckdb::LogicalType,_true>::operator[](&get->returned_types,local_50._0_8_);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&(info->scan_types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__x);
      pCVar3 = pCVar3 + 1;
    } while (pCVar3 != pCVar1);
  }
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&info->scan_types,
             &LogicalType::ROW_TYPE);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&info->names,
              &(get->names).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  ::std::__cxx11::string::_M_assign((string *)&(info->super_CreateInfo).schema);
  local_50._0_8_ = LogicalGet::GetTable(get);
  optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::TableCatalogEntry,_true> *)local_50);
  Catalog::GetName_abi_cxx11_(*(Catalog **)(local_50._0_8_ + 0xd8));
  ::std::__cxx11::string::_M_assign((string *)&(info->super_CreateInfo).catalog);
  LogicalGet::AddColumnId(get,0xffffffffffffffff);
  return;
}

Assistant:

void IndexBinder::InitCreateIndexInfo(LogicalGet &get, CreateIndexInfo &info, const string &schema) {
	auto &column_ids = get.GetColumnIds();
	for (auto &column_id : column_ids) {
		if (column_id.IsRowIdColumn()) {
			throw BinderException("cannot create an index on the rowid");
		}
		auto col_id = column_id.GetPrimaryIndex();
		info.column_ids.push_back(col_id);
		info.scan_types.push_back(get.returned_types[col_id]);
	}

	info.scan_types.emplace_back(LogicalType::ROW_TYPE);
	info.names = get.names;
	info.schema = schema;
	info.catalog = get.GetTable()->catalog.GetName();
	get.AddColumnId(COLUMN_IDENTIFIER_ROW_ID);
}